

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O2

lws * lws_create_adopt_udp
                (lws_vhost *vhost,char *ads,int port,int flags,char *protocol_name,char *ifname,
                lws *parent_wsi,void *opaque,lws_retry_bo_t *retry_policy)

{
  ushort uVar1;
  int iVar2;
  lws_sock_file_fd_type fd;
  lws *plVar3;
  char *pcVar4;
  addrinfo *paVar5;
  ulong uVar6;
  uint *puVar7;
  int __protocol;
  undefined4 local_a4;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  char *local_88;
  addrinfo *r;
  char buf [16];
  addrinfo local_68;
  
  local_88 = "null";
  if (ads != (char *)0x0) {
    local_88 = ads;
  }
  _lws_log(8,"%s: %s:%u\n","lws_create_adopt_udp",local_88,(ulong)(uint)port);
  plVar3 = lws_adopt_descriptor_vhost1
                     (vhost,LWS_ADOPT_RAW_SOCKET_UDP,protocol_name,parent_wsi,opaque);
  if (plVar3 == (lws *)0x0) {
    _lws_log(1,"%s: udp wsi creation failed\n","lws_create_adopt_udp");
  }
  else {
    *(ulong *)&plVar3->field_0x2dc =
         (ulong)((flags & 4U) << 7) |
         (ulong)((flags & 2U) << 9) |
         *(ulong *)&plVar3->field_0x2dc & 0xffffff7ffffff9ff | (ulong)(flags & 1) << 0x27;
    plVar3->c_port = (uint16_t)port;
    if (retry_policy == (lws_retry_bo_t *)0x0) {
      retry_policy = vhost->retry_policy;
    }
    plVar3->retry_policy = retry_policy;
    local_68.ai_addrlen = 0;
    local_68._20_4_ = 0;
    local_68.ai_addr = (sockaddr *)0x0;
    local_68.ai_canonname = (char *)0x0;
    local_68.ai_next = (addrinfo *)0x0;
    local_68.ai_socktype = 2;
    local_68.ai_protocol = 0x11;
    local_68.ai_flags = 0x21;
    local_68.ai_family = 0;
    lws_snprintf(buf,0x10,"%u",(ulong)(uint)port);
    iVar2 = getaddrinfo(ads,buf,&local_68,(addrinfo **)&r);
    if (iVar2 == 0) {
      local_a4 = 1;
      if (plVar3->dns_results == (addrinfo *)0x0) {
        plVar3->dns_results = r;
        plVar3->dns_results_next = r;
      }
      if (ads == (char *)0x0 || r != (addrinfo *)0x0) {
        paVar5 = plVar3->dns_results_next;
        local_a0 = 0x8000000200;
        while (paVar5 != (addrinfo *)0x0) {
          __protocol = 8;
          iVar2 = 0x11;
          if ((plVar3->field_0x2dd & 2) == 0) {
            iVar2 = paVar5->ai_family;
            __protocol = 0x11;
          }
          fd.sockfd = socket(iVar2,2,__protocol);
          if (fd.sockfd != -1) {
            *(uint16_t *)plVar3->dns_results_next->ai_addr->sa_data =
                 plVar3->c_port << 8 | plVar3->c_port >> 8;
            iVar2 = setsockopt(fd.sockfd,1,2,&local_a4,4);
            if (iVar2 < 0) {
              _lws_log(1,"%s: failed to set reuse\n","lws_create_adopt_udp2");
            }
            if (((plVar3->field_0x2dd & 4) != 0) &&
               (iVar2 = setsockopt(fd.sockfd,1,6,&local_a4,4), iVar2 < 0)) {
              _lws_log(1,"%s: failed to set broadcast\n","lws_create_adopt_udp2");
            }
            uVar6 = *(ulong *)&plVar3->field_0x2dc;
            if ((uVar6 & 0x8000000000) != 0) {
              iVar2 = bind(fd.sockfd,(sockaddr *)plVar3->dns_results_next->ai_addr,0x10);
              if (iVar2 == -1) {
                _lws_log(1,"%s: bind failed\n","lws_create_adopt_udp2");
                goto LAB_00136f98;
              }
              uVar6 = *(ulong *)&plVar3->field_0x2dc;
            }
            if ((local_a0 & uVar6) != 0) {
LAB_00137044:
              lws_addrinfo_clean(plVar3);
              plVar3 = lws_adopt_descriptor_vhost2(plVar3,LWS_ADOPT_RAW_SOCKET_UDP,fd);
              return plVar3;
            }
            iVar2 = connect(fd.sockfd,(sockaddr *)plVar3->dns_results_next->ai_addr,
                            plVar3->dns_results_next->ai_addrlen);
            if (iVar2 != -1) {
              memcpy(plVar3->udp,plVar3->dns_results_next->ai_addr,
                     (ulong)plVar3->dns_results_next->ai_addrlen);
              plVar3->udp->salen = plVar3->dns_results_next->ai_addrlen;
              goto LAB_00137044;
            }
            uVar1 = plVar3->dns_results_next->ai_addr->sa_family;
            local_90 = (ulong)plVar3->c_port;
            local_98 = (ulong)plVar3->dns_results_next->ai_addrlen;
            puVar7 = (uint *)__errno_location();
            _lws_log(1,"%s: conn fd %d fam %d %s:%u failed (salen %d) errno %d\n",
                     "lws_create_adopt_udp2",(ulong)(uint)fd.sockfd,(ulong)uVar1,local_88,local_90,
                     local_98,(ulong)*puVar7);
            close(fd.sockfd);
          }
LAB_00136f98:
          paVar5 = plVar3->dns_results_next->ai_next;
          plVar3->dns_results_next = paVar5;
        }
        puVar7 = (uint *)__errno_location();
        _lws_log(1,"%s: unable to create INET socket %d\n","lws_create_adopt_udp2",(ulong)*puVar7);
        lws_addrinfo_clean(plVar3);
      }
      else {
        _lws_log(4,"%s: bad: n %d, r %p\n","lws_create_adopt_udp2",0,0);
        plVar3->dns_results = (addrinfo *)0x0;
        plVar3->dns_results_next = (addrinfo *)0x0;
      }
    }
    else {
      pcVar4 = gai_strerror(iVar2);
      _lws_log(8,"%s: getaddrinfo error: %s\n","lws_create_adopt_udp",pcVar4);
    }
    lws_close_free_wsi(plVar3,LWS_CLOSE_STATUS_NOSTATUS,"adopt udp2 fail");
  }
  return (lws *)0x0;
}

Assistant:

struct lws *
lws_create_adopt_udp(struct lws_vhost *vhost, const char *ads, int port,
		     int flags, const char *protocol_name, const char *ifname,
		     struct lws *parent_wsi, void *opaque,
		     const lws_retry_bo_t *retry_policy)
{
#if !defined(LWS_PLAT_OPTEE)
	struct lws *wsi;
	int n;

	lwsl_info("%s: %s:%u\n", __func__, ads ? ads : "null", port);

	/* create the logical wsi without any valid fd */

	wsi = lws_adopt_descriptor_vhost1(vhost, LWS_ADOPT_RAW_SOCKET_UDP,
					  protocol_name, parent_wsi, opaque);
	if (!wsi) {
		lwsl_err("%s: udp wsi creation failed\n", __func__);
		goto bail;
	}
	wsi->do_bind = !!(flags & LWS_CAUDP_BIND);
	wsi->do_broadcast = !!(flags & LWS_CAUDP_BROADCAST);
	wsi->pf_packet = !!(flags & LWS_CAUDP_PF_PACKET);
	wsi->c_port = port;
	if (retry_policy)
		wsi->retry_policy = retry_policy;
	else
		wsi->retry_policy = vhost->retry_policy;

#if !defined(LWS_WITH_SYS_ASYNC_DNS)
	{
		struct addrinfo *r, h;
		char buf[16];

		memset(&h, 0, sizeof(h));
		h.ai_family = AF_UNSPEC;    /* Allow IPv4 or IPv6 */
		h.ai_socktype = SOCK_DGRAM;
		h.ai_protocol = IPPROTO_UDP;
		h.ai_flags = AI_PASSIVE;
#ifdef AI_ADDRCONFIG
		h.ai_flags |= AI_ADDRCONFIG;
#endif

		/* if the dns lookup is synchronous, do the whole thing now */
		lws_snprintf(buf, sizeof(buf), "%u", port);
		n = getaddrinfo(ads, buf, &h, &r);
		if (n) {
#if !defined(LWS_PLAT_FREERTOS)
			lwsl_info("%s: getaddrinfo error: %s\n", __func__,
				  gai_strerror(n));
#else
			lwsl_info("%s: getaddrinfo error: %s\n", __func__,
					strerror(n));
#endif
			//freeaddrinfo(r);
			goto bail1;
		}
		/* complete it immediately after the blocking dns lookup
		 * finished... free r when connect either completed or failed */
		wsi = lws_create_adopt_udp2(wsi, ads, r, 0, NULL);

		return wsi;
	}
#else
	if (ads) {
		/*
		 * with async dns, use the wsi as the point about which to do
		 * the dns lookup and have it call the second part when it's
		 * done.
		 *
		 * Keep a refcount on the results and free it when we connected
		 * or definitively failed.
		 *
		 * Notice wsi has no socket at this point (we don't know what
		 * kind to ask for until we get the dns back).  But it is bound
		 * to a vhost and can be cleaned up from that at vhost destroy.
		 */
		n = lws_async_dns_query(vhost->context, 0, ads,
					LWS_ADNS_RECORD_A,
					lws_create_adopt_udp2, wsi, (void *)ifname);
		lwsl_debug("%s: dns query returned %d\n", __func__, n);
		if (n == LADNS_RET_FAILED) {
			lwsl_err("%s: async dns failed\n", __func__);
			wsi = NULL;
			/*
			 * It was already closed by calling callback with error
			 * from lws_async_dns_query()
			 */
			goto bail;
		}
	} else {
		lwsl_debug("%s: udp adopt has no ads\n", __func__);
		wsi = lws_create_adopt_udp2(wsi, ads, NULL, 0, (void *)ifname);
	}

	/* dns lookup is happening asynchronously */

	lwsl_debug("%s: returning wsi %p\n", __func__, wsi);
	return wsi;
#endif
#if !defined(LWS_WITH_SYS_ASYNC_DNS)
bail1:
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "adopt udp2 fail");
	wsi = NULL;
#endif
bail:
	return wsi;
#else
	return NULL;
#endif
}